

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int sqlite3Fts5StorageConfigValue(Fts5Storage *p,char *z,sqlite3_value *pVal,int iVal)

{
  sqlite3_mutex *psVar1;
  Fts5Config *pFVar2;
  Vdbe *p_00;
  sqlite3_blob *pBlob_00;
  int iVar3;
  int iVar4;
  Vdbe *p_1;
  long in_FS_OFFSET;
  sqlite3_stmt *pReplace;
  sqlite3_blob *pBlob;
  Vdbe *local_50;
  sqlite3_blob *local_48;
  undefined1 local_3c;
  undefined1 local_3b;
  undefined1 local_3a;
  undefined1 local_39;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_50 = (Vdbe *)0x0;
  iVar3 = fts5StorageGetStmt(p,10,(sqlite3_stmt **)&local_50,(char **)0x0);
  p_00 = local_50;
  if (iVar3 == 0) {
    bindText((sqlite3_stmt *)local_50,1,z,-1,(_func_void_void_ptr *)0x0,'\x01');
    if (pVal == (sqlite3_value *)0x0) {
      sqlite3_bind_int64((sqlite3_stmt *)p_00,2,(long)iVal);
    }
    else {
      sqlite3_bind_value((sqlite3_stmt *)p_00,2,pVal);
    }
    sqlite3_step((sqlite3_stmt *)p_00);
    iVar3 = sqlite3_reset((sqlite3_stmt *)p_00);
    iVar4 = vdbeUnbind(p_00,0);
    if ((iVar4 == 0) && (psVar1 = p_00->db->mutex, psVar1 != (sqlite3_mutex *)0x0)) {
      (*sqlite3Config.mutex.xMutexLeave)(psVar1);
    }
    if (pVal != (sqlite3_value *)0x0 && iVar3 == 0) {
      iVar4 = p->pConfig->iCookie + 1;
      pFVar2 = p->pIndex->pConfig;
      local_48 = (sqlite3_blob *)0x0;
      local_3c = (undefined1)((uint)iVar4 >> 0x18);
      local_3b = (undefined1)((uint)iVar4 >> 0x10);
      local_3a = (undefined1)((uint)iVar4 >> 8);
      local_39 = (undefined1)iVar4;
      iVar3 = sqlite3_blob_open(pFVar2->db,pFVar2->zDb,p->pIndex->zDataTbl,"block",10,1,&local_48);
      pBlob_00 = local_48;
      if (iVar3 == 0) {
        blobReadWrite(local_48,&local_3c,4,0,sqlite3BtreePutData);
        iVar3 = sqlite3_blob_close(pBlob_00);
        if (iVar3 == 0) {
          p->pConfig->iCookie = iVar4;
          iVar3 = 0;
        }
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return iVar3;
}

Assistant:

static int sqlite3Fts5StorageConfigValue(
  Fts5Storage *p,
  const char *z,
  sqlite3_value *pVal,
  int iVal
){
  sqlite3_stmt *pReplace = 0;
  int rc = fts5StorageGetStmt(p, FTS5_STMT_REPLACE_CONFIG, &pReplace, 0);
  if( rc==SQLITE_OK ){
    sqlite3_bind_text(pReplace, 1, z, -1, SQLITE_STATIC);
    if( pVal ){
      sqlite3_bind_value(pReplace, 2, pVal);
    }else{
      sqlite3_bind_int(pReplace, 2, iVal);
    }
    sqlite3_step(pReplace);
    rc = sqlite3_reset(pReplace);
    sqlite3_bind_null(pReplace, 1);
  }
  if( rc==SQLITE_OK && pVal ){
    int iNew = p->pConfig->iCookie + 1;
    rc = sqlite3Fts5IndexSetCookie(p->pIndex, iNew);
    if( rc==SQLITE_OK ){
      p->pConfig->iCookie = iNew;
    }
  }
  return rc;
}